

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O2

int uv_inet_pton(int af,char *src,void *dst)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  uchar *dst_00;
  ushort uVar8;
  char cVar9;
  long local_a8;
  uchar *local_a0;
  char *local_98;
  char *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 *local_70;
  char tmp [46];
  
  if (dst == (void *)0x0 || src == (char *)0x0) {
    return -0x16;
  }
  if (af != 10) {
    if (af == 2) {
      iVar1 = inet_pton4(src,(uchar *)dst);
      return iVar1;
    }
    return -0x61;
  }
  pcVar3 = strchr(src,0x25);
  local_90 = src;
  if (pcVar3 != (char *)0x0) {
    iVar1 = (int)pcVar3 - (int)src;
    if (0x2d < iVar1) {
      return -0x16;
    }
    local_90 = tmp;
    memcpy(local_90,src,(long)iVar1);
    tmp[iVar1] = '\0';
  }
  local_88 = 0;
  uStack_80 = 0;
  cVar9 = *local_90;
  if (cVar9 == ':') {
    if (local_90[1] != ':') {
      return -0x16;
    }
    local_70 = (undefined8 *)dst;
    local_90 = local_90 + 1;
  }
  else {
    local_70 = (undefined8 *)dst;
  }
  local_a8 = 0;
  iVar1 = 0;
  uVar2 = 0;
  local_a0 = (uchar *)0x0;
  local_98 = local_90;
  local_70 = (undefined8 *)dst;
  do {
    local_90 = local_90 + 1;
    uVar8 = (ushort)uVar2;
    if (cVar9 == '\0') {
      if (iVar1 != 0) {
        if (0xe < local_a8) {
          return -0x16;
        }
        *(ushort *)((long)&local_88 + local_a8) = uVar8 << 8 | uVar8 >> 8;
        local_a8 = local_a8 + 2;
      }
LAB_0010a897:
      if (local_a0 == (uchar *)0x0) {
        if (local_a8 != 0x10) {
          return -0x16;
        }
      }
      else {
        if (local_a8 == 0x10) {
          return -0x16;
        }
        uVar2 = ((int)&local_a8 + (int)local_a8 + 0x20) - (int)local_a0;
        lVar5 = 0;
        uVar7 = 0;
        if (0 < (int)uVar2) {
          uVar7 = (ulong)uVar2;
        }
        for (; -lVar5 != uVar7; lVar5 = lVar5 + -1) {
          *(uchar *)((long)&uStack_80 + lVar5 + 7) = local_a0[lVar5 + (long)(int)uVar2 + -1];
          local_a0[lVar5 + (long)(int)uVar2 + -1] = '\0';
        }
      }
      *local_70 = local_88;
      local_70[1] = uStack_80;
      return 0;
    }
    pvVar4 = memchr("0123456789abcdef",(int)cVar9,0x11);
    if (pvVar4 == (void *)0x0) {
      pvVar4 = memchr("0123456789ABCDEF",(int)cVar9,0x11);
      lVar5 = local_a8;
      if (pvVar4 != (void *)0x0) {
        iVar6 = 0x11e350;
        goto LAB_0010a7cb;
      }
      dst_00 = (uchar *)((long)&local_88 + local_a8);
      if (cVar9 != ':') {
        if (cVar9 != '.') {
          return -0x16;
        }
        if (0xc < local_a8) {
          return -0x16;
        }
        iVar1 = inet_pton4(local_98,dst_00);
        if (iVar1 != 0) {
          return -0x16;
        }
        local_a8 = lVar5 + 4;
        goto LAB_0010a897;
      }
      if (iVar1 == 0) {
        iVar1 = 0;
        local_98 = local_90;
        if (local_a0 != (uchar *)0x0) {
          return -0x16;
        }
      }
      else {
        local_98 = local_90;
        if (*local_90 == '\0') {
          return -0x16;
        }
        if (0xe < local_a8) {
          return -0x16;
        }
        *(ushort *)((long)&local_88 + local_a8) = uVar8 << 8 | uVar8 >> 8;
        local_a8 = local_a8 + 2;
        iVar1 = 0;
        uVar2 = 0;
        dst_00 = local_a0;
      }
    }
    else {
      iVar6 = 0x11e330;
LAB_0010a7cb:
      if (3 < iVar1) {
        return -0x16;
      }
      uVar2 = (int)pvVar4 - iVar6 | uVar2 << 4;
      iVar1 = iVar1 + 1;
      dst_00 = local_a0;
    }
    cVar9 = *local_90;
    local_a0 = dst_00;
  } while( true );
}

Assistant:

int uv_inet_pton(int af, const char* src, void* dst) {
  if (src == NULL || dst == NULL)
    return UV_EINVAL;

  switch (af) {
  case AF_INET:
    return (inet_pton4(src, dst));
  case AF_INET6: {
    int len;
    char tmp[UV__INET6_ADDRSTRLEN], *s, *p;
    s = (char*) src;
    p = strchr(src, '%');
    if (p != NULL) {
      s = tmp;
      len = p - src;
      if (len > UV__INET6_ADDRSTRLEN-1)
        return UV_EINVAL;
      memcpy(s, src, len);
      s[len] = '\0';
    }
    return inet_pton6(s, dst);
  }
  default:
    return UV_EAFNOSUPPORT;
  }
  /* NOTREACHED */
}